

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::BasicWriter<wchar_t>::write_double<long_double>
          (BasicWriter<wchar_t> *this,longdouble value,FormatSpec *spec)

{
  bool bVar1;
  int iVar2;
  Alignment AVar3;
  wchar_t wVar4;
  uint uVar5;
  wchar_t wVar6;
  size_t sVar7;
  AlignSpec *pAVar8;
  CharPtr pwVar9;
  wchar_t *__src;
  wchar_t *pwVar10;
  FormatSpec *in_RSI;
  BasicWriter<wchar_t> *in_RDI;
  longdouble in_stack_00000008;
  CharPtr p;
  int result;
  size_t buffer_size;
  wchar_t *start;
  uint n;
  wchar_t fill;
  uint width_for_sprintf;
  wchar_t *format_ptr;
  wchar_t format [10];
  uint width;
  size_t offset;
  CharPtr out_1;
  char *inf;
  size_t inf_size;
  CharPtr out;
  char *nan;
  size_t nan_size;
  char sign;
  bool upper;
  char type;
  undefined2 uVar11;
  undefined6 in_stack_fffffffffffffea2;
  double in_stack_fffffffffffffea8;
  BasicWriter<wchar_t> *in_stack_fffffffffffffeb0;
  undefined2 in_stack_fffffffffffffeb8;
  size_t in_stack_fffffffffffffec0;
  AlignSpec *in_stack_fffffffffffffec8;
  uint total_size;
  size_t in_stack_fffffffffffffed0;
  wchar_t *pwVar12;
  char *in_stack_fffffffffffffed8;
  BasicWriter<wchar_t> *in_stack_fffffffffffffee0;
  char *local_100;
  char *local_f8;
  char local_e9;
  wchar_t *local_b8;
  uint local_ac;
  wchar_t *local_a0;
  undefined4 local_98;
  wchar_t local_94 [12];
  uint local_64;
  size_t local_60;
  char *local_50;
  undefined8 local_48;
  char *local_38;
  undefined8 local_30;
  char local_23;
  byte local_22;
  char local_21;
  FormatSpec *local_20;
  longdouble local_18;
  
  local_18 = in_stack_00000008;
  local_20 = in_RSI;
  local_21 = FormatSpec::type(in_RSI);
  local_22 = 0;
  iVar2 = (int)local_21;
  if (local_21 == '\0') {
    local_21 = 'g';
  }
  else if ((iVar2 == 0x41) || (iVar2 - 0x45U < 3)) {
    local_22 = 1;
  }
  else if ((iVar2 != 0x61) && (2 < iVar2 - 0x65U)) {
    internal::report_unknown_type(local_21 >> 7,(char *)in_RDI);
  }
  local_23 = '\0';
  bVar1 = std::numeric_limits<fmt::internal::DummyInt>::isnegative(in_stack_fffffffffffffea8);
  if (bVar1) {
    local_23 = '-';
    local_18 = -local_18;
  }
  else {
    bVar1 = FormatSpec::flag(local_20,1);
    if (bVar1) {
      bVar1 = FormatSpec::flag(local_20,2);
      local_e9 = '+';
      if (!bVar1) {
        local_e9 = ' ';
      }
      local_23 = local_e9;
    }
  }
  bVar1 = std::numeric_limits<fmt::internal::DummyInt>::isnotanumber<long_double>
                    ((longdouble)CONCAT28(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0));
  if (bVar1) {
    local_30 = 4;
    if ((local_22 & 1) == 0) {
      local_f8 = " nan";
    }
    else {
      local_f8 = " NAN";
    }
    local_38 = local_f8;
    if (local_23 == '\0') {
      local_30 = 3;
      local_38 = local_f8 + 1;
    }
    pwVar9 = write_str<char>(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                             in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
    if (local_23 != '\0') {
      *pwVar9 = (int)local_23;
    }
  }
  else {
    sVar7 = SUB108(local_18,0);
    uVar11 = (undefined2)((unkuint10)local_18 >> 0x40);
    bVar1 = std::numeric_limits<fmt::internal::DummyInt>::isinfinity<long_double>
                      ((longdouble)CONCAT28(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0));
    if (bVar1) {
      local_48 = 4;
      if ((local_22 & 1) == 0) {
        local_100 = " inf";
      }
      else {
        local_100 = " INF";
      }
      local_50 = local_100;
      if (local_23 == '\0') {
        local_48 = 3;
        local_50 = local_100 + 1;
      }
      pwVar9 = write_str<char>(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                               in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
      if (local_23 != '\0') {
        *pwVar9 = (int)local_23;
      }
    }
    else {
      local_60 = Buffer<wchar_t>::size(*(Buffer<wchar_t> **)(in_RDI + 8));
      local_64 = WidthSpec::width((WidthSpec *)local_20);
      if (local_23 != '\0') {
        Buffer<wchar_t>::size(*(Buffer<wchar_t> **)(in_RDI + 8));
        Buffer<wchar_t>::reserve
                  ((Buffer<wchar_t> *)CONCAT62(in_stack_fffffffffffffea2,uVar11),sVar7);
        if (local_64 != 0) {
          local_64 = local_64 - 1;
        }
        local_60 = local_60 + 1;
      }
      local_a0 = local_94;
      local_98 = 0x25;
      bVar1 = FormatSpec::flag(local_20,8);
      if (bVar1) {
        pwVar12 = local_a0 + 1;
        *local_a0 = L'#';
        local_a0 = pwVar12;
      }
      AVar3 = AlignSpec::align(&local_20->super_AlignSpec);
      if (AVar3 != ALIGN_CENTER) {
        AVar3 = AlignSpec::align(&local_20->super_AlignSpec);
        if (AVar3 == ALIGN_LEFT) {
          *local_a0 = L'-';
          local_a0 = local_a0 + 1;
        }
        if (local_64 != 0) {
          *local_a0 = L'*';
          local_a0 = local_a0 + 1;
        }
      }
      iVar2 = FormatSpec::precision(local_20);
      if (-1 < iVar2) {
        pwVar12 = local_a0 + 1;
        *local_a0 = L'.';
        local_a0 = local_a0 + 2;
        *pwVar12 = L'*';
      }
      append_float_length(in_RDI,&local_a0,local_18);
      *local_a0 = (int)local_21;
      local_a0[1] = L'\0';
      local_a0 = local_a0 + 1;
      wVar4 = WidthSpec::fill((WidthSpec *)local_20);
      wVar4 = internal::BasicCharTraits<wchar_t>::cast(wVar4);
      while( true ) {
        while( true ) {
          sVar7 = Buffer<wchar_t>::capacity(*(Buffer<wchar_t> **)(in_RDI + 8));
          pwVar10 = (wchar_t *)(sVar7 - local_60);
          local_b8 = Buffer<wchar_t>::operator[](*(Buffer<wchar_t> **)(in_RDI + 8),local_60);
          pwVar12 = local_b8;
          FormatSpec::precision(local_20);
          sVar7 = SUB108(local_18,0);
          uVar11 = (undefined2)((unkuint10)local_18 >> 0x40);
          iVar2 = internal::CharTraits<wchar_t>::format_float<long_double>
                            (pwVar10,(size_t)pwVar12,(wchar_t *)in_stack_fffffffffffffec8,
                             (uint)(in_stack_fffffffffffffec0 >> 0x20),
                             (int)in_stack_fffffffffffffec0,
                             (longdouble)
                             CONCAT28(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0));
          if (-1 < iVar2) break;
          in_stack_fffffffffffffec0 = *(size_t *)(in_RDI + 8);
          Buffer<wchar_t>::capacity(*(Buffer<wchar_t> **)(in_RDI + 8));
          Buffer<wchar_t>::reserve
                    ((Buffer<wchar_t> *)CONCAT62(in_stack_fffffffffffffea2,uVar11),sVar7);
        }
        local_ac = internal::to_unsigned<int>(iVar2);
        in_stack_fffffffffffffec8 = (AlignSpec *)(local_60 + local_ac);
        pAVar8 = (AlignSpec *)Buffer<wchar_t>::capacity(*(Buffer<wchar_t> **)(in_RDI + 8));
        if (in_stack_fffffffffffffec8 < pAVar8) break;
        Buffer<wchar_t>::reserve
                  ((Buffer<wchar_t> *)CONCAT62(in_stack_fffffffffffffea2,uVar11),sVar7);
      }
      if (local_23 != '\0') {
        AVar3 = AlignSpec::align(&local_20->super_AlignSpec);
        if (((AVar3 == ALIGN_RIGHT) ||
            (AVar3 = AlignSpec::align(&local_20->super_AlignSpec), AVar3 == ALIGN_DEFAULT)) &&
           (*local_b8 == L' ')) {
          local_b8[-1] = wVar4;
        }
        else {
          local_b8[-1] = (int)local_23;
          local_23 = '\0';
        }
        local_ac = local_ac + 1;
      }
      total_size = (uint)((ulong)in_stack_fffffffffffffec8 >> 0x20);
      AVar3 = AlignSpec::align(&local_20->super_AlignSpec);
      if ((AVar3 == ALIGN_CENTER) &&
         (uVar5 = WidthSpec::width((WidthSpec *)local_20), local_ac < uVar5)) {
        local_64 = WidthSpec::width((WidthSpec *)local_20);
        pwVar9 = grow_buffer(in_stack_fffffffffffffeb0,(size_t)in_stack_fffffffffffffea8);
        pwVar10 = get(pwVar9);
        pwVar10 = pwVar10 + (local_64 - local_ac >> 1);
        __src = get(pwVar9);
        memmove(pwVar10,__src,(ulong)local_ac << 2);
        wVar4 = (wchar_t)((ulong)pwVar9 >> 0x20);
        WidthSpec::width((WidthSpec *)local_20);
        fill_padding(pwVar12,total_size,in_stack_fffffffffffffec0,wVar4);
      }
      else {
        wVar6 = WidthSpec::fill((WidthSpec *)local_20);
        if ((wVar6 != L' ') || (local_23 != '\0')) {
          while (*local_b8 == L' ') {
            *local_b8 = wVar4;
            local_b8 = local_b8 + 1;
          }
          if (local_23 != '\0') {
            local_b8[-1] = (int)local_23;
          }
        }
        grow_buffer(in_stack_fffffffffffffeb0,(size_t)in_stack_fffffffffffffea8);
      }
    }
  }
  return;
}

Assistant:

void BasicWriter<Char>::write_double(T value, const FormatSpec &spec) {
  // Check type.
  char type = spec.type();
  bool upper = false;
  switch (type) {
  case 0:
    type = 'g';
    break;
  case 'e': case 'f': case 'g': case 'a':
    break;
  case 'F':
#if FMT_MSC_VER
    // MSVC's printf doesn't support 'F'.
    type = 'f';
#endif
    // Fall through.
  case 'E': case 'G': case 'A':
    upper = true;
    break;
  default:
    internal::report_unknown_type(type, "double");
    break;
  }

  char sign = 0;
  // Use isnegative instead of value < 0 because the latter is always
  // false for NaN.
  if (internal::FPUtil::isnegative(static_cast<double>(value))) {
    sign = '-';
    value = -value;
  } else if (spec.flag(SIGN_FLAG)) {
    sign = spec.flag(PLUS_FLAG) ? '+' : ' ';
  }

  if (internal::FPUtil::isnotanumber(value)) {
    // Format NaN ourselves because sprintf's output is not consistent
    // across platforms.
    std::size_t nan_size = 4;
    const char *nan = upper ? " NAN" : " nan";
    if (!sign) {
      --nan_size;
      ++nan;
    }
    CharPtr out = write_str(nan, nan_size, spec);
    if (sign)
      *out = sign;
    return;
  }

  if (internal::FPUtil::isinfinity(value)) {
    // Format infinity ourselves because sprintf's output is not consistent
    // across platforms.
    std::size_t inf_size = 4;
    const char *inf = upper ? " INF" : " inf";
    if (!sign) {
      --inf_size;
      ++inf;
    }
    CharPtr out = write_str(inf, inf_size, spec);
    if (sign)
      *out = sign;
    return;
  }

  std::size_t offset = buffer_.size();
  unsigned width = spec.width();
  if (sign) {
    buffer_.reserve(buffer_.size() + (width > 1u ? width : 1u));
    if (width > 0)
      --width;
    ++offset;
  }

  // Build format string.
  enum { MAX_FORMAT_SIZE = 10}; // longest format: %#-*.*Lg
  Char format[MAX_FORMAT_SIZE];
  Char *format_ptr = format;
  *format_ptr++ = '%';
  unsigned width_for_sprintf = width;
  if (spec.flag(HASH_FLAG))
    *format_ptr++ = '#';
  if (spec.align() == ALIGN_CENTER) {
    width_for_sprintf = 0;
  } else {
    if (spec.align() == ALIGN_LEFT)
      *format_ptr++ = '-';
    if (width != 0)
      *format_ptr++ = '*';
  }
  if (spec.precision() >= 0) {
    *format_ptr++ = '.';
    *format_ptr++ = '*';
  }

  append_float_length(format_ptr, value);
  *format_ptr++ = type;
  *format_ptr = '\0';

  // Format using snprintf.
  Char fill = internal::CharTraits<Char>::cast(spec.fill());
  unsigned n = 0;
  Char *start = 0;
  for (;;) {
    std::size_t buffer_size = buffer_.capacity() - offset;
#if FMT_MSC_VER
    // MSVC's vsnprintf_s doesn't work with zero size, so reserve
    // space for at least one extra character to make the size non-zero.
    // Note that the buffer's capacity will increase by more than 1.
    if (buffer_size == 0) {
      buffer_.reserve(offset + 1);
      buffer_size = buffer_.capacity() - offset;
    }
#endif
    start = &buffer_[offset];
    int result = internal::CharTraits<Char>::format_float(
        start, buffer_size, format, width_for_sprintf, spec.precision(), value);
    if (result >= 0) {
      n = internal::to_unsigned(result);
      if (offset + n < buffer_.capacity())
        break;  // The buffer is large enough - continue with formatting.
      buffer_.reserve(offset + n + 1);
    } else {
      // If result is negative we ask to increase the capacity by at least 1,
      // but as std::vector, the buffer grows exponentially.
      buffer_.reserve(buffer_.capacity() + 1);
    }
  }
  if (sign) {
    if ((spec.align() != ALIGN_RIGHT && spec.align() != ALIGN_DEFAULT) ||
        *start != ' ') {
      *(start - 1) = sign;
      sign = 0;
    } else {
      *(start - 1) = fill;
    }
    ++n;
  }
  if (spec.align() == ALIGN_CENTER && spec.width() > n) {
    width = spec.width();
    CharPtr p = grow_buffer(width);
    std::memmove(get(p) + (width - n) / 2, get(p), n * sizeof(Char));
    fill_padding(p, spec.width(), n, fill);
    return;
  }
  if (spec.fill() != ' ' || sign) {
    while (*start == ' ')
      *start++ = fill;
    if (sign)
      *(start - 1) = sign;
  }
  grow_buffer(n);
}